

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::detail::Dispatch_Engine::get_object
          (Dispatch_Engine *this,string_view name,atomic_uint_fast32_t *t_loc,Stack_Holder *t_holder
          )

{
  long lVar1;
  long lVar2;
  long lVar3;
  _Base_ptr p_Var4;
  string_view t_name;
  int iVar5;
  const_iterator cVar6;
  ulong uVar7;
  char *__n;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  pthread_rwlock_t *__rwlock;
  long in_R9;
  uint uVar9;
  pointer t_hint;
  size_type __rlen;
  long lVar10;
  long lVar11;
  Boxed_Value BVar12;
  pair<unsigned_long,_chaiscript::Boxed_Value> obj;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  Stack_Holder *local_88;
  Dispatch_Engine *local_80;
  long local_78;
  pointer local_70;
  pointer local_68;
  pthread_rwlock_t *local_60;
  long local_58;
  long local_50;
  pair<unsigned_long,_chaiscript::Boxed_Value> local_48;
  
  __n = name._M_str;
  __rwlock = (pthread_rwlock_t *)name._M_len;
  t_hint = (t_holder->stacks).
           super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98._M_len = (size_t)__n;
  local_98._M_str = (char *)t_loc;
  if (t_hint == (pointer)0x0) {
    local_70 = (pointer)0x80000000;
    local_58 = *(long *)(in_R9 + 8);
    local_50 = *(long *)(local_58 + -0x18);
    lVar11 = *(long *)(local_58 + -0x10);
    local_88 = t_holder;
    local_80 = this;
    local_68 = t_hint;
    local_60 = __rwlock;
    if (lVar11 != local_50) {
      do {
        lVar2 = *(long *)(lVar11 + -0x18);
        lVar3 = *(long *)(lVar11 + -0x10);
        local_78 = lVar2;
        if (lVar2 != lVar3) {
          lVar10 = 0;
          do {
            if ((__n == *(char **)(lVar2 + 8 + lVar10)) &&
               ((__n == (char *)0x0 ||
                (iVar5 = bcmp(t_loc,*(void **)(lVar2 + lVar10),(size_t)__n), iVar5 == 0)))) {
              _Var8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((lVar10 >> 4) * -0x5555555555555555);
              LOCK();
              (local_88->stacks).
              super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)((ulong)_Var8._M_pi | 0xc0000000 |
                            (*(long *)(local_58 + -0x10) - lVar11) * 0x800);
              UNLOCK();
              (local_80->m_mutex)._M_impl._M_rwlock.__align = *(long *)(local_78 + 0x20 + lVar10);
              lVar11 = *(long *)(local_78 + 0x28 + lVar10);
              this = local_80;
              goto LAB_001bbab9;
            }
            lVar1 = lVar2 + lVar10;
            lVar10 = lVar10 + 0x30;
          } while (lVar1 + 0x30 != lVar3);
        }
        lVar11 = lVar11 + -0x20;
      } while (lVar11 != local_50);
    }
    LOCK();
    (local_88->stacks).
    super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_70;
    UNLOCK();
    this = local_80;
    t_hint = local_68;
    __rwlock = local_60;
    t_holder = local_88;
  }
  else {
    uVar9 = (uint)t_hint;
    if ((uVar9 >> 0x1e & 1) != 0) {
      lVar11 = *(long *)(*(long *)(*(long *)(in_R9 + 8) + -0x10) + 8 +
                        ((ulong)(~uVar9 >> 0xb & 0x1ffe0) | 0xfffffffffffe0000));
      uVar7 = (ulong)((uVar9 & 0xffff) * 0x30);
      _Var8._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar11 + 0x20 + uVar7);
      (this->m_mutex)._M_impl._M_rwlock.__align = (long)_Var8._M_pi;
      lVar11 = *(long *)(lVar11 + 0x28 + uVar7);
LAB_001bbab9:
      *(long *)((long)&(this->m_mutex)._M_impl._M_rwlock + 8) = lVar11;
      if (lVar11 != 0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(lVar11 + 8) = *(int *)(lVar11 + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(lVar11 + 8) = *(int *)(lVar11 + 8) + 1;
        }
      }
      goto LAB_001bbb4b;
    }
  }
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  cVar6 = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
          ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>,std::_Select1st<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>,chaiscript::str_less,std::allocator<std::pair<std::__cxx11::string_const,chaiscript::Boxed_Value>>>
                      *)((long)__rwlock + 0x160),&local_98);
  if (cVar6._M_node == (_Base_ptr)((long)__rwlock + 0x168)) {
    t_name._M_str = local_98._M_str;
    t_name._M_len = local_98._M_len;
    get_function_object_int(&local_48,(Dispatch_Engine *)&__rwlock->__data,t_name,(size_t)t_hint);
    if ((pointer)local_48.first != t_hint) {
      LOCK();
      (t_holder->stacks).
      super__Vector_base<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>,_std::allocator<std::vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_48.first;
      UNLOCK();
    }
    (this->m_mutex)._M_impl._M_rwlock.__align =
         (long)local_48.second.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&(this->m_mutex)._M_impl._M_rwlock + 8)
         = local_48.second.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
    if (local_48.second.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.second.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.second.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.second.m_data.
         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_48.second.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    if (local_48.second.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.second.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    (this->m_mutex)._M_impl._M_rwlock.__align = *(long *)(cVar6._M_node + 2);
    p_Var4 = cVar6._M_node[2]._M_parent;
    *(_Base_ptr *)((long)&(this->m_mutex)._M_impl._M_rwlock + 8) = p_Var4;
    if (p_Var4 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&p_Var4->_M_parent = *(int *)&p_Var4->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&p_Var4->_M_parent = *(int *)&p_Var4->_M_parent + 1;
      }
    }
  }
  pthread_rwlock_unlock(__rwlock);
  _Var8._M_pi = extraout_RDX;
LAB_001bbb4b:
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var8._M_pi;
  BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar12.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Boxed_Value get_object(std::string_view name, std::atomic_uint_fast32_t &t_loc, Stack_Holder &t_holder) const {
        enum class Loc : uint_fast32_t {
          located = 0x80000000,
          is_local = 0x40000000,
          stack_mask = 0x0FFF0000,
          loc_mask = 0x0000FFFF
        };

        uint_fast32_t loc = t_loc;

        if (loc == 0) {
          auto &stack = get_stack_data(t_holder);

          // Is it in the stack?
          for (auto stack_elem = stack.rbegin(); stack_elem != stack.rend(); ++stack_elem) {
            for (auto s = stack_elem->begin(); s != stack_elem->end(); ++s) {
              if (s->first == name) {
                t_loc = static_cast<uint_fast32_t>(std::distance(stack.rbegin(), stack_elem) << 16)
                    | static_cast<uint_fast32_t>(std::distance(stack_elem->begin(), s)) | static_cast<uint_fast32_t>(Loc::located)
                    | static_cast<uint_fast32_t>(Loc::is_local);
                return s->second;
              }
            }
          }

          t_loc = static_cast<uint_fast32_t>(Loc::located);
        } else if ((loc & static_cast<uint_fast32_t>(Loc::is_local)) != 0u) {
          auto &stack = get_stack_data(t_holder);

          return stack[stack.size() - 1 - ((loc & static_cast<uint_fast32_t>(Loc::stack_mask)) >> 16)].at_index(
              loc & static_cast<uint_fast32_t>(Loc::loc_mask));
        }

        // Is the value we are looking for a global or function?
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        const auto itr = m_state.m_global_objects.find(name);
        if (itr != m_state.m_global_objects.end()) {
          return itr->second;
        }

        // no? is it a function object?
        auto obj = get_function_object_int(name, loc);
        if (obj.first != loc) {
          t_loc = uint_fast32_t(obj.first);
        }

        return obj.second;
      }